

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterSparseCoDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *this_00;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  int i;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  this_00 = (this->super_SPxPricer<double>).thesolver;
  lVar10 = (long)(this_00->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar10) {
    pdVar5 = (this_00->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this_00->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this_00->infeasibilitiesCo).super_IdxSet.idx;
    uVar11 = lVar10 + 1;
    i = -1;
    do {
      iVar3 = piVar7[uVar11 - 2];
      dVar1 = pdVar5[iVar3];
      if (-feastol <= dVar1) {
        iVar4 = (this_00->infeasibilitiesCo).super_IdxSet.num;
        (this_00->infeasibilitiesCo).super_IdxSet.num = iVar4 + -1;
        piVar7[uVar11 - 2] = piVar7[(long)iVar4 + -1];
        (this_00->isInfeasibleCo).data[iVar3] = 0;
      }
      else {
        dVar2 = pdVar6[iVar3];
        dVar12 = feastol;
        if (feastol <= dVar2) {
          dVar12 = dVar2;
        }
        dVar12 = (dVar1 * dVar1) / dVar12;
        if (*best <= dVar12 && dVar12 != *best) {
          *best = dVar12;
          this->last = pdVar6[iVar3];
          i = iVar3;
        }
      }
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
    if (-1 < i) {
      SVar8 = SPxSolverBase<double>::id(this_00,i);
      return (SPxId)SVar8.super_DataKey;
    }
  }
  DVar9.info = 0;
  DVar9.idx = -1;
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}